

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void __thiscall
PowerPos<0,_0,_0>::PowerPos(PowerPos<0,_0,_0> *this,IntView<0> _x,IntView<0> _y,IntView<0> _z)

{
  IntView<0> *in_RCX;
  undefined8 in_RDX;
  _func_int **in_RSI;
  Propagator *in_RDI;
  _func_int **in_R8;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  undefined1 uStack0000000000000010;
  undefined1 uStack0000000000000011;
  undefined6 uStack0000000000000012;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Propagator *p;
  
  p = in_RDI;
  Propagator::Propagator(in_RDI);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__PowerPos_0031e558;
  in_RDI[1]._vptr_Propagator = in_RSI;
  in_RDI[1].prop_id = (int)in_RDX;
  in_RDI[1].priority = (int)((ulong)in_RDX >> 0x20);
  *(IntView<0> **)&in_RDI[1].satisfied = in_RCX;
  in_RDI[2]._vptr_Propagator = in_R8;
  in_RDI[2].prop_id = uStack0000000000000008;
  in_RDI[2].priority = uStack000000000000000c;
  in_RDI[2].satisfied = (Tchar)uStack0000000000000010;
  in_RDI[2].in_queue = (bool)uStack0000000000000011;
  *(undefined6 *)&in_RDI[2].field_0x12 = uStack0000000000000012;
  in_RDI->priority = 1;
  IntView<0>::attach(in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  IntView<0>::attach(in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  IntView<0>::attach(in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

PowerPos(IntView<X> _x, IntView<Y> _y, IntView<Z> _z) : x(_x), y(_y), z(_z) {
		priority = 1;
		assert(x.getMin() >= 0);
		assert(y.getMin() > 0);
		x.attach(this, 0, EVENT_LU);
		y.attach(this, 1, EVENT_LU);
		z.attach(this, 2, EVENT_LU);
	}